

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

int __thiscall ImDrawList::_CalcCircleAutoSegmentCount(ImDrawList *this,float radius)

{
  long in_RDI;
  float in_XMM0_Da;
  float fVar1;
  int radius_idx;
  undefined4 local_4;
  
  if ((int)(in_XMM0_Da + 0.999999) < 0x40) {
    local_4 = (uint)*(byte *)(*(long *)(in_RDI + 0x38) + 0x1c4 + (long)(int)(in_XMM0_Da + 0.999999))
    ;
  }
  else {
    fVar1 = ImMin<float>(*(float *)(*(long *)(in_RDI + 0x38) + 0x18),in_XMM0_Da);
    fVar1 = acosf(1.0 - fVar1 / in_XMM0_Da);
    fVar1 = ceilf(3.1415927 / fVar1);
    local_4 = ImClamp<int>(((int)fVar1 + 1) / 2 << 1,4,0x200);
  }
  return local_4;
}

Assistant:

int ImDrawList::_CalcCircleAutoSegmentCount(float radius) const
{
    // Automatic segment count
    const int radius_idx = (int)(radius + 0.999999f); // ceil to never reduce accuracy
    if (radius_idx < IM_ARRAYSIZE(_Data->CircleSegmentCounts))
        return _Data->CircleSegmentCounts[radius_idx]; // Use cached value
    else
        return IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC(radius, _Data->CircleSegmentMaxError);
}